

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_zdd.c
# Opt level: O0

ZDD zdd_set_union(ZDD set1,ZDD set2)

{
  uint32_t var;
  uint32_t var_00;
  zddnode_t n;
  zddnode_t n_00;
  ZDD ZVar1;
  ZDD set2_00;
  ZDD sub_2;
  ZDD sub_1;
  ZDD sub;
  uint32_t set2_var;
  uint32_t set1_var;
  zddnode_t set2_node;
  zddnode_t set1_node;
  ZDD set2_local;
  ZDD set1_local;
  
  set1_local = set2;
  if (((set1 != 0x8000000000000000) && (set1_local = set1, set2 != 0x8000000000000000)) &&
     (set1 != set2)) {
    n = ZDD_GETNODE(set1);
    n_00 = ZDD_GETNODE(set2);
    var = zddnode_getvariable(n);
    var_00 = zddnode_getvariable(n_00);
    if (var < var_00) {
      ZVar1 = zddnode_high(set1,n);
      ZVar1 = zdd_set_union(ZVar1,set2);
      set1_local = zdd_makenode(var,ZVar1,ZVar1);
    }
    else if (var_00 < var) {
      ZVar1 = zddnode_high(set2,n_00);
      ZVar1 = zdd_set_union(set1,ZVar1);
      set1_local = zdd_makenode(var_00,ZVar1,ZVar1);
    }
    else {
      ZVar1 = zddnode_high(set1,n);
      set2_00 = zddnode_high(set2,n_00);
      ZVar1 = zdd_set_union(ZVar1,set2_00);
      set1_local = zdd_makenode(var,ZVar1,ZVar1);
    }
  }
  return set1_local;
}

Assistant:

ZDD
zdd_set_union(ZDD set1, ZDD set2)
{
    if (set1 == zdd_true) return set2;
    if (set2 == zdd_true) return set1;
    if (set1 == set2) return set1;

    zddnode_t set1_node = ZDD_GETNODE(set1);
    zddnode_t set2_node = ZDD_GETNODE(set2);
    uint32_t set1_var = zddnode_getvariable(set1_node);
    uint32_t set2_var = zddnode_getvariable(set2_node);

    if (set1_var < set2_var) {
        ZDD sub = zdd_set_union(zddnode_high(set1, set1_node), set2);
        return zdd_makenode(set1_var, sub, sub);
    } else if (set1_var > set2_var) {
        ZDD sub = zdd_set_union(set1, zddnode_high(set2, set2_node));
        return zdd_makenode(set2_var, sub, sub);
    } else {
        ZDD sub = zdd_set_union(zddnode_high(set1, set1_node), zddnode_high(set2, set2_node));
        return zdd_makenode(set1_var, sub, sub);
    }
}